

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void __thiscall CVmObjDict::mark_undo_ref(CVmObjDict *this,CVmUndoRecord *undo_rec)

{
  int *piVar1;
  dict_undo_rec *rec;
  
  piVar1 = (int *)(undo_rec->id).ptrval;
  if ((piVar1 != (int *)0x0) && (*piVar1 == 2)) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,piVar1[1],2);
    return;
  }
  return;
}

Assistant:

void CVmObjDict::mark_undo_ref(VMG_ CVmUndoRecord *undo_rec)
{
    /* check our private record if we have one */
    if (undo_rec->id.ptrval != 0)
    {
        dict_undo_rec *rec;

        /* get my undo record */
        rec = (dict_undo_rec *)undo_rec->id.ptrval;

        /* take the appropriate action */
        switch(rec->action)
        {
        case DICT_UNDO_COMPARATOR:
            /* the 'obj' entry is the old comparator object */
            G_obj_table->mark_all_refs(rec->obj, VMOBJ_REACHABLE);
            break;

        case DICT_UNDO_ADD:
        case DICT_UNDO_DEL:
            /* 
             *   these actions use only weak references, so there's nothing
             *   to do here 
             */
            break;
        }
    }
}